

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

bool __thiscall
MeCab::DecoderFeatureIndex::openFromArray(DecoderFeatureIndex *this,char *begin,char *end)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (ulong)*(uint *)begin;
  (this->super_FeatureIndex).maxid_ = uVar1;
  lVar2 = uVar1 * 0x10 + 0x24;
  if (lVar2 == (long)end - (long)begin) {
    this->charset_ = begin + 4;
    (this->super_FeatureIndex).alpha_ = (double *)(begin + 0x24);
    this->key_ = (uint64_t *)(begin + uVar1 * 8 + 0x24);
  }
  return lVar2 == (long)end - (long)begin;
}

Assistant:

inline void read_static(const char **ptr, T& value) {
  const char *r = read_ptr(ptr, sizeof(T));
  memcpy(&value, r, sizeof(T));
}